

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::SystemTimingCheckSyntax::SystemTimingCheckSyntax
          (SystemTimingCheckSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token name,Token openParen,
          SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *args,Token closeParen,Token semi
          )

{
  size_t sVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  TimingCheckArgSyntax *pTVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *__range2;
  iterator_base<slang::syntax::TimingCheckArgSyntax_*> local_40;
  
  uVar5 = name._0_8_;
  uVar6 = openParen._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,SystemTimingCheck,attributes);
  (this->name).kind = (short)uVar5;
  (this->name).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->name).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->name).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->name).info = name.info;
  (this->openParen).kind = (short)uVar6;
  (this->openParen).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->openParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->openParen).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->openParen).info = openParen.info;
  uVar3 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->args).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->args).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->args).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (this->args).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->args).super_SyntaxListBase.childCount = (args->super_SyntaxListBase).childCount;
  (this->args).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002dbdf0;
  sVar1 = (args->elements)._M_extent._M_extent_value;
  (this->args).elements._M_ptr = (args->elements)._M_ptr;
  (this->args).elements._M_extent._M_extent_value = sVar1;
  (this->closeParen).kind = closeParen.kind;
  (this->closeParen).field_0x2 = closeParen._2_1_;
  (this->closeParen).numFlags = (NumericTokenFlags)closeParen.numFlags.raw;
  (this->closeParen).rawLen = closeParen.rawLen;
  (this->closeParen).info = closeParen.info;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  (this->args).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  local_40.index = 0;
  sVar1 = (this->args).elements._M_extent._M_extent_value;
  local_40.list = &this->args;
  for (; (local_40.list != &this->args || (local_40.index != sVar1 + 1 >> 1));
      local_40.index = local_40.index + 1) {
    pTVar4 = SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax>::
             iterator_base<slang::syntax::TimingCheckArgSyntax_*>::dereference(&local_40);
    (pTVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

SystemTimingCheckSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token name, Token openParen, const SeparatedSyntaxList<TimingCheckArgSyntax>& args, Token closeParen, Token semi) :
        MemberSyntax(SyntaxKind::SystemTimingCheck, attributes), name(name), openParen(openParen), args(args), closeParen(closeParen), semi(semi) {
        this->args.parent = this;
        for (auto child : this->args)
            child->parent = this;
    }